

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceDescriptor::DebugString
          (ServiceDescriptor *this,string *contents,DebugStringOptions *debug_string_options)

{
  int iVar1;
  SourceLocationCommentPrinter *this_00;
  DescriptorPool *output;
  char *in_RSI;
  ServiceDescriptor *in_RDI;
  int i;
  DebugStringOptions *in_stack_00000218;
  string *in_stack_00000220;
  int in_stack_0000022c;
  MethodDescriptor *in_stack_00000230;
  SourceLocationCommentPrinter comment_printer;
  string *in_stack_fffffffffffffcb8;
  SubstituteArg *in_stack_fffffffffffffcc0;
  SourceLocationCommentPrinter *this_01;
  DebugStringOptions *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  ServiceDescriptor *in_stack_fffffffffffffcf8;
  SourceLocationCommentPrinter *in_stack_fffffffffffffd00;
  string *output_00;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  int iVar2;
  int index;
  SubstituteArg local_2c8;
  SubstituteArg local_298;
  SubstituteArg local_268;
  SubstituteArg local_238;
  undefined1 local_208 [96];
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148 [2];
  allocator<char> local_d1;
  string local_d0 [8];
  SubstituteArg *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  SubstituteArg *in_stack_ffffffffffffff48;
  SubstituteArg *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  DescriptorPool *in_stack_ffffffffffffff60;
  Message *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  SubstituteArg *in_stack_ffffffffffffff78;
  SubstituteArg *in_stack_ffffffffffffff80;
  SubstituteArg *in_stack_ffffffffffffff88;
  SubstituteArg *in_stack_ffffffffffffff90;
  SubstituteArg *in_stack_ffffffffffffff98;
  
  output_00 = (string *)&local_d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,anon_var_dwarf_2ad0d6 + 0x11,(allocator *)output_00);
  anon_unknown_1::SourceLocationCommentPrinter::
  SourceLocationCommentPrinter<google::protobuf::ServiceDescriptor>
            (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8,
             (string *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
             in_stack_fffffffffffffce8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  anon_unknown_1::SourceLocationCommentPrinter::AddPreComment
            ((SourceLocationCommentPrinter *)
             CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),output_00);
  name_abi_cxx11_(in_RDI);
  strings::internal::SubstituteArg::SubstituteArg
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  strings::internal::SubstituteArg::SubstituteArg(local_148);
  strings::internal::SubstituteArg::SubstituteArg(&local_178);
  strings::internal::SubstituteArg::SubstituteArg(&local_1a8);
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_208 + 0x30));
  strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_208);
  strings::internal::SubstituteArg::SubstituteArg(&local_238);
  strings::internal::SubstituteArg::SubstituteArg(&local_268);
  strings::internal::SubstituteArg::SubstituteArg(&local_298);
  strings::internal::SubstituteArg::SubstituteArg(&local_2c8);
  this_01 = (SourceLocationCommentPrinter *)local_208;
  strings::SubstituteAndAppend
            ((string *)in_stack_ffffffffffffff60,(char *)in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (SubstituteArg *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
             (SubstituteArg *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  options(in_RDI);
  this_00 = (SourceLocationCommentPrinter *)file(in_RDI);
  output = FileDescriptor::pool((FileDescriptor *)this_00);
  anon_unknown_1::FormatLineOptions
            (in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  iVar2 = 0;
  while( true ) {
    index = iVar2;
    iVar1 = method_count(in_RDI);
    if (iVar1 <= iVar2) break;
    method(in_RDI,index);
    MethodDescriptor::DebugString
              (in_stack_00000230,in_stack_0000022c,in_stack_00000220,in_stack_00000218);
    iVar2 = index + 1;
  }
  std::__cxx11::string::append(in_RSI);
  anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(this_00,(string *)output);
  anon_unknown_1::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(this_01);
  return;
}

Assistant:

void ServiceDescriptor::DebugString(
    std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  SourceLocationCommentPrinter comment_printer(this, /* prefix */ "",
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  strings::SubstituteAndAppend(contents, "service $0 {\n", name());

  FormatLineOptions(1, options(), file()->pool(), contents);

  for (int i = 0; i < method_count(); i++) {
    method(i)->DebugString(1, contents, debug_string_options);
  }

  contents->append("}\n");

  comment_printer.AddPostComment(contents);
}